

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall
helics::CoreBroker::findRegexMatch
          (CoreBroker *this,string *target,InterfaceType type,GlobalHandle handle,uint16_t flags)

{
  HandleManager *this_00;
  BasicHandleInfo *pBVar1;
  BasicHandleInfo *origin;
  InterfaceType IVar2;
  ulong uVar3;
  GlobalHandle *pGVar4;
  ulong uVar5;
  ushort uVar6;
  ulong uStack_140;
  vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> matches;
  GlobalHandle *local_100;
  BasicHandleInfo local_d8;
  
  this_00 = &this->handles;
  pBVar1 = HandleManager::findHandle(this_00,handle);
  HandleManager::regexSearch
            ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)&matches,this_00
             ,(string *)target,type);
  pGVar4 = _matches;
  IVar2 = PUBLICATION;
  if (type != INPUT) {
    IVar2 = (type == PUBLICATION) * '\x04' + ENDPOINT;
  }
  for (; pGVar4 != local_100; pGVar4 = pGVar4 + 1) {
    origin = HandleManager::findHandle(this_00,*pGVar4);
    if (origin != (BasicHandleInfo *)0x0) {
      uVar6 = flags;
      if (pBVar1 == (BasicHandleInfo *)0x0) {
        if (type == ENDPOINT) {
          uVar6 = flags ^ 2;
        }
        local_d8.local_fed_id.fid = -2000000000;
        local_d8.used = false;
        local_d8.flags = 0;
        local_d8.key._M_dataplus._M_p = (pointer)&local_d8.key.field_2;
        local_d8.key._M_string_length = 0;
        local_d8.key.field_2._M_local_buf[0] = '\0';
        local_d8.type._M_dataplus._M_p = (pointer)&local_d8.type.field_2;
        local_d8.type._M_string_length = 0;
        local_d8.type.field_2._M_local_buf[0] = '\0';
        local_d8.units._M_dataplus._M_p = (pointer)&local_d8.units.field_2;
        local_d8.units._M_string_length = 0;
        local_d8.units.field_2._M_local_buf[0] = '\0';
        local_d8.type_in = &local_d8.type;
        local_d8.type_out = &local_d8.units;
        local_d8.tags.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_d8.tags.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_d8.tags.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_d8.handle = handle;
        local_d8.handleType = IVar2;
      }
      else {
        if (pBVar1->handleType == FILTER) {
          uVar6 = flags | pBVar1->flags & 0x200;
          flags = uVar6;
        }
        else if (type == ENDPOINT) {
          uVar6 = flags ^ 2;
        }
        BasicHandleInfo::BasicHandleInfo(&local_d8,pBVar1);
      }
      uStack_140 = 0x3e;
      if (type != FILTER) {
        if (type == INPUT) {
          uStack_140 = 0x46;
        }
        else if (type == PUBLICATION) {
          uStack_140 = 0x32;
        }
        else {
          uStack_140 = 0x5a;
        }
      }
      uVar3 = 0x5a00000000;
      if ((pBVar1 != (BasicHandleInfo *)0x0) && (uVar3 = 0x5a00000000, pBVar1->handleType == FILTER)
         ) {
        uVar3 = 0x3e00000000;
      }
      uVar5 = 0x5a00000000;
      if (type != FILTER) {
        if (type == INPUT) {
          uVar5 = 0x3200000000;
        }
        else {
          uVar5 = uVar3;
          if (type == PUBLICATION) {
            uVar5 = 0x4600000000;
          }
        }
      }
      connectInterfaces(this,origin,(uint)flags,&local_d8,(uint)uVar6,
                        (pair<helics::action_message_def::action_t,_helics::action_message_def::action_t>
                         )(uVar5 | uStack_140));
      BasicHandleInfo::~BasicHandleInfo(&local_d8);
    }
  }
  std::_Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::~_Vector_base
            ((_Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)&matches);
  return;
}

Assistant:

void CoreBroker::findRegexMatch(const std::string& target,
                                InterfaceType type,
                                GlobalHandle handle,
                                uint16_t flags)
{
    const auto* dest = handles.findHandle(handle);

    try {
        auto matches = handles.regexSearch(target, type);
        for (auto& mtch : matches) {
            const auto* hnd = handles.findHandle(mtch);
            if (hnd == nullptr) {
                continue;
            }
            auto destFlags = flags;
            if (dest != nullptr && dest->handleType == InterfaceType::FILTER) {
                if (checkActionFlag(*dest, clone_flag)) {
                    destFlags |= make_flags(clone_flag);
                    flags |= make_flags(clone_flag);
                }
            }
            if (type == InterfaceType::ENDPOINT &&
                (dest == nullptr || dest->handleType != InterfaceType::FILTER)) {
                destFlags = toggle_flag(destFlags, destination_target);
            }
            connectInterfaces(*hnd,
                              flags,
                              (dest != nullptr) ? *dest :
                                                  BasicHandleInfo(handle, getMatchType(type)),

                              destFlags,
                              std::make_pair(getAction(type),
                                             getMatchAction(type,
                                                            (dest != nullptr) ?
                                                                dest->handleType :
                                                                getMatchType(type))));
        }
    }
    catch (const std::invalid_argument& ia) {
        LOG_WARNING(global_id.load(),
                    getIdentifier(),
                    fmt::format("invalid regular expression processing {}", ia.what()));
    }
}